

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::icdf(beta_dist<long_double> *this,result_type_conflict3 x)

{
  int *piVar1;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  longdouble in_stack_00000008;
  undefined8 in_stack_ffffffffffffff92;
  undefined6 uVar2;
  undefined2 in_stack_ffffffffffffffa6;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffffb2;
  undefined6 uVar5;
  undefined2 uVar6;
  
  uVar6 = SUB102(in_stack_00000008,0);
  if ((in_stack_00000008 < (longdouble)0) || ((longdouble)1 < in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    in_RDI = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  else if (((in_stack_00000008 != (longdouble)0) || (NAN(in_stack_00000008) || NAN((longdouble)0)))
          && ((in_stack_00000008 != (longdouble)1 || (NAN(in_stack_00000008) || NAN((longdouble)1)))
             )) {
    uVar5 = SUB106(in_stack_00000008,0);
    param_type::alpha(in_RDI,in_RSI);
    uVar3 = (undefined2)in_ST0;
    uVar4 = (undefined2)((unkuint10)in_ST0 >> 0x40);
    param_type::beta(in_RDI,in_RSI);
    uVar2 = (undefined6)((unkuint10)in_ST1 >> 0x20);
    param_type::norm(in_RDI,in_RSI);
    in_RDI = (result_type_conflict3 *)
             math::inv_Beta_I((longdouble)CONCAT28(uVar6,in_RDI),
                              (longdouble)CONCAT64(uVar5,CONCAT22(in_stack_ffffffffffffffb2,uVar4)),
                              (longdouble)CONCAT28(uVar3,CONCAT26(in_stack_ffffffffffffffa6,uVar2)),
                              (longdouble)
                              CONCAT82(in_stack_ffffffffffffff92,(short)((unkuint10)in_ST2 >> 0x40))
                             );
  }
  return in_RDI;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return 1;
      return math::inv_Beta_I(x, P.alpha(), P.beta(), P.norm());
    }